

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

FormatFlags deqp::gls::FboUtil::formatFlag(GLenum context)

{
  FormatFlags FVar1;
  
  if (context == 0) {
    return ANY_FORMAT;
  }
  if (context == 0x1702) {
    FVar1 = TEXTURE_VALID;
  }
  else if (context == 0x8d00) {
    FVar1 = DEPTH_RENDERABLE;
  }
  else if (context == 0x8d20) {
    FVar1 = STENCIL_RENDERABLE;
  }
  else {
    if (context != 0x8d41) {
      return COLOR_RENDERABLE;
    }
    FVar1 = RENDERBUFFER_VALID;
  }
  return FVar1;
}

Assistant:

FormatFlags formatFlag (GLenum context)
{
	switch (context)
	{
		case GL_NONE:
			return FormatFlags(0);
		case GL_RENDERBUFFER:
			return RENDERBUFFER_VALID;
		case GL_TEXTURE:
			return TEXTURE_VALID;
		case GL_STENCIL_ATTACHMENT:
			return STENCIL_RENDERABLE;
		case GL_DEPTH_ATTACHMENT:
			return DEPTH_RENDERABLE;
		default:
			DE_ASSERT(context >= GL_COLOR_ATTACHMENT0 && context <= GL_COLOR_ATTACHMENT15);
			return COLOR_RENDERABLE;
	}
}